

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SC.cpp
# Opt level: O2

void __thiscall
OpenMD::SC::addExplicitInteraction
          (SC *this,AtomType *atype1,AtomType *atype2,RealType epsilon,RealType m,RealType n,
          RealType alpha)

{
  long lVar1;
  int iVar2;
  CubicSpline *this_00;
  CubicSpline *this_01;
  long lVar3;
  int k;
  int iVar4;
  RealType r;
  RealType local_d0;
  double local_c8;
  RealType local_c0;
  double local_b8;
  RealType local_b0;
  RealType local_a8;
  double local_a0;
  vector<double,_std::allocator<double>_> phivals;
  vector<double,_std::allocator<double>_> vvals;
  vector<double,_std::allocator<double>_> rvals;
  
  local_d0 = alpha;
  local_c0 = n;
  local_b0 = m;
  local_a8 = epsilon;
  addType(this,atype1);
  addType(this,atype2);
  iVar4 = this->np_;
  rvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  rvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  rvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  vvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  phivals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  phivals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  phivals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  r = 0.0;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&rvals,&r);
  r = 0.0;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&vvals,&r);
  r = 0.0;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&phivals,&r);
  local_b8 = local_d0 + local_d0;
  local_c8 = local_b8 / (double)(iVar4 + -1);
  for (iVar4 = 1; iVar4 < this->np_; iVar4 = iVar4 + 1) {
    r = (double)iVar4 * local_c8;
    std::vector<double,_std::allocator<double>_>::push_back(&rvals,&r);
    local_a0 = pow(local_d0 / r,local_c0);
    local_a0 = local_a0 * local_a8;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(&vvals,&local_a0);
    local_a0 = pow(local_d0 / r,local_b0);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(&phivals,&local_a0);
  }
  local_c8 = pow(local_d0 / local_b8,local_c0);
  this_00 = (CubicSpline *)operator_new(0xa0);
  CubicSpline::CubicSpline(this_00);
  CubicSpline::addPoints(this_00,&rvals,&vvals);
  this_01 = (CubicSpline *)operator_new(0xa0);
  CubicSpline::CubicSpline(this_01);
  CubicSpline::addPoints(this_01,&rvals,&phivals);
  iVar4 = AtomType::getIdent(atype1);
  iVar4 = (this->SCtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar4];
  iVar2 = AtomType::getIdent(atype2);
  iVar2 = (this->SCtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar2];
  lVar1 = *(long *)&(this->MixingMap).
                    super__Vector_base<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar4].
                    super__Vector_base<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>
                    ._M_impl.super__Vector_impl_data;
  lVar3 = (long)iVar2 * 0x48;
  *(RealType *)(lVar1 + lVar3) = local_d0;
  *(RealType *)(lVar1 + 8 + lVar3) = local_a8;
  *(RealType *)(lVar1 + 0x10 + lVar3) = local_b0;
  *(RealType *)(lVar1 + 0x18 + lVar3) = local_c0;
  *(double *)(lVar1 + 0x20 + lVar3) = local_b8;
  *(double *)(lVar1 + 0x28 + lVar3) = local_c8 * local_a8;
  *(CubicSpline **)(lVar1 + 0x30 + lVar3) = this_00;
  *(CubicSpline **)(lVar1 + 0x38 + lVar3) = this_01;
  *(undefined1 *)(lVar1 + 0x40 + lVar3) = 1;
  if (iVar2 != iVar4) {
    lVar1 = *(long *)&(this->MixingMap).
                      super__Vector_base<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar2].
                      super__Vector_base<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>
                      ._M_impl.super__Vector_impl_data;
    lVar3 = (long)iVar4 * 0x48;
    *(RealType *)(lVar1 + lVar3) = local_d0;
    *(RealType *)(lVar1 + 8 + lVar3) = local_a8;
    *(RealType *)(lVar1 + 0x10 + lVar3) = local_b0;
    *(RealType *)(lVar1 + 0x18 + lVar3) = local_c0;
    *(double *)(lVar1 + 0x20 + lVar3) = local_b8;
    *(double *)(lVar1 + 0x28 + lVar3) = local_c8 * local_a8;
    *(CubicSpline **)(lVar1 + 0x30 + lVar3) = this_00;
    *(CubicSpline **)(lVar1 + 0x38 + lVar3) = this_01;
    *(undefined1 *)(lVar1 + 0x40 + lVar3) = 1;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&phivals.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&vvals.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&rvals.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void SC::addExplicitInteraction(AtomType* atype1, AtomType* atype2,
                                  RealType epsilon, RealType m, RealType n,
                                  RealType alpha) {
    // in case these weren't already in the map
    addType(atype1);
    addType(atype2);

    SCInteractionData mixer;

    mixer.epsilon = epsilon;
    mixer.m       = m;
    mixer.n       = n;
    mixer.alpha   = alpha;
    mixer.rCut    = 2.0 * mixer.alpha;

    RealType dr = mixer.rCut / (np_ - 1);
    vector<RealType> rvals;
    vector<RealType> vvals;
    vector<RealType> phivals;

    rvals.push_back(0.0);
    vvals.push_back(0.0);
    phivals.push_back(0.0);

    for (int k = 1; k < np_; k++) {
      RealType r = dr * k;
      rvals.push_back(r);
      vvals.push_back(mixer.epsilon * pow(mixer.alpha / r, mixer.n));
      phivals.push_back(pow(mixer.alpha / r, mixer.m));
    }

    mixer.vCut = mixer.epsilon * pow(mixer.alpha / mixer.rCut, mixer.n);

    CubicSpline* V = new CubicSpline();
    V->addPoints(rvals, vvals);

    CubicSpline* phi = new CubicSpline();
    phi->addPoints(rvals, phivals);

    mixer.V   = V;
    mixer.phi = phi;

    mixer.explicitlySet = true;

    int sctid1 = SCtids[atype1->getIdent()];
    int sctid2 = SCtids[atype2->getIdent()];

    MixingMap[sctid1][sctid2] = mixer;
    if (sctid2 != sctid1) { MixingMap[sctid2][sctid1] = mixer; }
    return;
  }